

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

void __thiscall
cppnet::BufferQueue::BufferQueue
          (BufferQueue *this,shared_ptr<cppnet::BlockMemoryPool> *block_pool,
          shared_ptr<cppnet::AlloterWrap> *alloter)

{
  shared_ptr<cppnet::AlloterWrap> *alloter_local;
  shared_ptr<cppnet::BlockMemoryPool> *block_pool_local;
  BufferQueue *this_local;
  
  InnerBuffer::InnerBuffer(&this->super_InnerBuffer);
  (this->super_InnerBuffer).super_Buffer._vptr_Buffer = (_func_int **)&PTR__BufferQueue_00167708;
  this->_can_read_length = 0;
  List<cppnet::BufferBlock>::List(&this->_buffer_list);
  std::shared_ptr<cppnet::BufferBlock>::shared_ptr(&this->_buffer_write);
  std::shared_ptr<cppnet::BlockMemoryPool>::shared_ptr(&this->_block_alloter,block_pool);
  std::shared_ptr<cppnet::AlloterWrap>::shared_ptr(&this->_alloter,alloter);
  return;
}

Assistant:

BufferQueue::BufferQueue(const std::shared_ptr<BlockMemoryPool>& block_pool, 
    const std::shared_ptr<AlloterWrap>& alloter):
    _can_read_length(0),
    _block_alloter(block_pool),
    _alloter(alloter) {

}